

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

int xcb_input_query_device_state_sizeof(void *_buffer)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  uint xcb_tmp_len;
  uint i;
  uint xcb_align_to;
  uint xcb_pad;
  uint xcb_block_len;
  uint xcb_buffer_len;
  xcb_input_query_device_state_reply_t *_aux;
  char *xcb_tmp;
  undefined4 local_2c;
  int iVar3;
  
  iVar1 = 0x20;
  iVar3 = 0;
  for (local_2c = 0; local_2c < *(byte *)(in_RDI + 8); local_2c = local_2c + 1) {
    iVar2 = xcb_input_input_state_sizeof((void *)CONCAT44(iVar1,iVar3));
    iVar3 = iVar2 + iVar3;
  }
  return iVar3 + iVar1;
}

Assistant:

int
xcb_input_query_device_state_sizeof (const void  *_buffer)
{
    char *xcb_tmp = (char *)_buffer;
    const xcb_input_query_device_state_reply_t *_aux = (xcb_input_query_device_state_reply_t *)_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_block_len = 0;
    unsigned int xcb_pad = 0;
    unsigned int xcb_align_to = 0;

    unsigned int i;
    unsigned int xcb_tmp_len;

    xcb_block_len += sizeof(xcb_input_query_device_state_reply_t);
    xcb_tmp += xcb_block_len;
    xcb_buffer_len += xcb_block_len;
    xcb_block_len = 0;
    /* classes */
    for(i=0; i<_aux->num_classes; i++) {
        xcb_tmp_len = xcb_input_input_state_sizeof(xcb_tmp);
        xcb_block_len += xcb_tmp_len;
        xcb_tmp += xcb_tmp_len;
    }
    xcb_align_to = ALIGNOF(xcb_input_input_state_t);
    /* insert padding */
    xcb_pad = -xcb_block_len & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_tmp += xcb_pad;
        xcb_pad = 0;
    }
    xcb_block_len = 0;

    return xcb_buffer_len;
}